

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  Allocator *_allocator;
  reference pvVar4;
  reference ppLVar5;
  long *in_RSI;
  long in_RDI;
  int lr;
  int j_4;
  int j_3;
  int dims;
  Blob *blob_3;
  int j_2;
  int *psh;
  Mat shape_hints;
  int pdlr;
  char blob_name [256];
  Blob *blob_2;
  int j_1;
  Blob *blob;
  Blob *blob_1;
  int bottom_blob_index;
  char bottom_name [256];
  int j;
  Layer *layer;
  int top_count;
  int bottom_count;
  char layer_name [256];
  char layer_type [256];
  int i;
  int blob_index;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  char *in_stack_ffffffffffffefa8;
  Mat *in_stack_ffffffffffffefb0;
  Layer *in_stack_ffffffffffffefb8;
  undefined4 in_stack_ffffffffffffefc0;
  int in_stack_ffffffffffffefc4;
  Net *in_stack_ffffffffffffefc8;
  Mat *in_stack_ffffffffffffefd0;
  ParamDict *in_stack_ffffffffffffefd8;
  Mat *in_stack_ffffffffffffefe0;
  ParamDict *in_stack_ffffffffffffeff0;
  int in_stack_fffffffffffff000;
  int in_stack_fffffffffffff004;
  int in_stack_fffffffffffff010;
  int in_stack_fffffffffffff014;
  allocator *in_stack_fffffffffffff018;
  int local_f88;
  int local_f84;
  Mat local_f40;
  Mat local_f00;
  int local_ebc;
  reference local_eb8;
  int local_eac;
  int *local_ea8;
  Mat local_ea0;
  Mat local_e60;
  int local_e20;
  allocator local_e19;
  string local_e18 [32];
  char local_df8 [256];
  reference local_cf8;
  int local_cec;
  reference local_ce8;
  allocator local_cd9;
  string local_cd8 [32];
  reference local_cb8;
  int local_cac;
  char local_ca8 [256];
  int local_ba8;
  allocator local_ba1;
  string local_ba0 [39];
  allocator local_b79;
  string local_b78 [32];
  Layer *local_b58;
  undefined4 local_b50;
  int local_b40;
  int local_b3c;
  char local_b38 [256];
  char local_a38 [264];
  int local_930;
  int local_92c;
  undefined1 local_928 [2308];
  int local_24;
  int local_20;
  int local_1c;
  long *local_18;
  int local_4;
  
  local_1c = 0;
  local_18 = in_RSI;
  iVar2 = (**(code **)(*in_RSI + 0x10))(in_RSI,"%d",&local_1c);
  if (iVar2 == 1) {
    if (local_1c == 0x7685dd) {
      local_20 = 0;
      local_24 = 0;
      iVar2 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_20);
      if (iVar2 == 1) {
        iVar2 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_24);
        if (iVar2 == 1) {
          if ((local_20 < 1) || (local_24 < 1)) {
            fprintf(_stderr,"invalid layer_count or blob_count");
            fprintf(_stderr,"\n");
            local_4 = -1;
          }
          else {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                       in_stack_ffffffffffffefd0,(size_type)in_stack_ffffffffffffefc8);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_stack_ffffffffffffefd0,
                       (size_type)in_stack_ffffffffffffefc8);
            ParamDict::ParamDict(in_stack_ffffffffffffeff0);
            local_92c = 0;
            for (local_930 = 0; local_930 < local_20; local_930 = local_930 + 1) {
              local_b3c = 0;
              local_b40 = 0;
              iVar2 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_a38);
              if (iVar2 != 1) {
                fprintf(_stderr,"parse layer_type failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_0016ad63;
              }
              iVar2 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_b38);
              if (iVar2 != 1) {
                fprintf(_stderr,"parse layer_name failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_0016ad63;
              }
              iVar2 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_b3c);
              if (iVar2 != 1) {
                fprintf(_stderr,"parse bottom_count failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_0016ad63;
              }
              iVar2 = (**(code **)(*local_18 + 0x10))(local_18,"%d",&local_b40);
              if (iVar2 != 1) {
                fprintf(_stderr,"parse top_count failed");
                fprintf(_stderr,"\n");
                local_4 = -1;
                goto LAB_0016ad63;
              }
              local_b58 = create_layer(in_stack_ffffffffffffefa8);
              if (local_b58 == (Layer *)0x0) {
                local_b58 = create_custom_layer((Net *)in_stack_ffffffffffffefb8,
                                                (char *)in_stack_ffffffffffffefb0);
              }
              if (local_b58 == (Layer *)0x0) {
                fprintf(_stderr,"layer %s not exists or registered",local_a38);
                fprintf(_stderr,"\n");
                clear((Net *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000));
                local_4 = -1;
                goto LAB_0016ad63;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_b78,local_a38,&local_b79);
              std::__cxx11::string::operator=((string *)&local_b58->type,local_b78);
              std::__cxx11::string::~string(local_b78);
              std::allocator<char>::~allocator((allocator<char> *)&local_b79);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_ba0,local_b38,&local_ba1);
              std::__cxx11::string::operator=((string *)&local_b58->name,local_ba0);
              std::__cxx11::string::~string(local_ba0);
              std::allocator<char>::~allocator((allocator<char> *)&local_ba1);
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefd0,
                         (size_type)in_stack_ffffffffffffefc8);
              for (local_ba8 = 0; local_ba8 < local_b3c; local_ba8 = local_ba8 + 1) {
                iVar2 = (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_ca8);
                if (iVar2 != 1) {
                  fprintf(_stderr,"parse bottom_name failed");
                  fprintf(_stderr,"\n");
                  local_4 = -1;
                  goto LAB_0016ad63;
                }
                local_cac = find_blob_index_by_name
                                      (in_stack_ffffffffffffefc8,
                                       (char *)CONCAT44(in_stack_ffffffffffffefc4,
                                                        in_stack_ffffffffffffefc0));
                if (local_cac == -1) {
                  local_cb8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                        ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                         (in_RDI + 0x28),(long)local_92c);
                  local_cac = local_92c;
                  in_stack_fffffffffffff018 = &local_cd9;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_cd8,local_ca8,in_stack_fffffffffffff018);
                  std::__cxx11::string::operator=((string *)local_cb8,local_cd8);
                  std::__cxx11::string::~string(local_cd8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
                  local_92c = local_92c + 1;
                }
                local_ce8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI + 0x28),(long)local_cac);
                std::vector<int,_std::allocator<int>_>::push_back
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
                           (value_type_conflict *)in_stack_ffffffffffffefb8);
                in_stack_fffffffffffff014 = local_cac;
                pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_b58->bottoms,(long)local_ba8);
                *pvVar3 = in_stack_fffffffffffff014;
              }
              std::vector<int,_std::allocator<int>_>::resize
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffefd0,
                         (size_type)in_stack_ffffffffffffefc8);
              for (local_cec = 0; local_cec < local_b40; local_cec = local_cec + 1) {
                local_cf8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                      ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                       (in_RDI + 0x28),(long)local_92c);
                in_stack_fffffffffffff010 =
                     (**(code **)(*local_18 + 0x10))(local_18,"%255s",local_df8);
                if (in_stack_fffffffffffff010 != 1) {
                  fprintf(_stderr,"parse blob_name failed");
                  fprintf(_stderr,"\n");
                  local_4 = -1;
                  goto LAB_0016ad63;
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_e18,local_df8,&local_e19);
                std::__cxx11::string::operator=((string *)local_cf8,local_e18);
                std::__cxx11::string::~string(local_e18);
                std::allocator<char>::~allocator((allocator<char> *)&local_e19);
                local_cf8->producer = local_930;
                in_stack_fffffffffffff004 = local_92c;
                pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                   (&local_b58->tops,(long)local_cec);
                *pvVar3 = in_stack_fffffffffffff004;
                local_92c = local_92c + 1;
              }
              in_stack_fffffffffffff000 =
                   ParamDict::load_param
                             ((ParamDict *)in_stack_fffffffffffff018,
                              (DataReader *)
                              CONCAT44(in_stack_fffffffffffff014,in_stack_fffffffffffff010));
              local_e20 = in_stack_fffffffffffff000;
              if (in_stack_fffffffffffff000 == 0) {
                ncnn::Mat::Mat(&local_ea0);
                ParamDict::get(in_stack_ffffffffffffefd8,
                               (int)((ulong)in_stack_ffffffffffffefd0 >> 0x20),
                               (Mat *)in_stack_ffffffffffffefc8);
                ncnn::Mat::~Mat((Mat *)0x16a806);
                bVar1 = ncnn::Mat::empty(in_stack_ffffffffffffefb0);
                if (!bVar1) {
                  local_ea8 = ncnn::Mat::operator_cast_to_int_(&local_e60);
                  for (local_eac = 0; local_eac < local_b40; local_eac = local_eac + 1) {
                    _allocator = (Allocator *)(in_RDI + 0x28);
                    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                       (&local_b58->tops,(long)local_eac);
                    local_eb8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                          ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                           _allocator,(long)*pvVar3);
                    local_ebc = *local_ea8;
                    if (local_ebc == 1) {
                      ncnn::Mat::Mat(&local_f00,local_ea8[1],(void *)0x0,4,1,(Allocator *)0x0);
                      ncnn::Mat::operator=
                                ((Mat *)in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
                      ncnn::Mat::~Mat((Mat *)0x16a91a);
                    }
                    if (local_ebc == 2) {
                      in_stack_ffffffffffffefa8 = (char *)0x0;
                      ncnn::Mat::Mat(&local_f40,local_ea8[1],local_ea8[2],(void *)0x0,4,1,
                                     (Allocator *)0x0);
                      ncnn::Mat::operator=
                                ((Mat *)in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
                      ncnn::Mat::~Mat((Mat *)0x16a9ee);
                    }
                    if (local_ebc == 3) {
                      in_stack_ffffffffffffefb0 = (Mat *)0x0;
                      in_stack_ffffffffffffefa8 =
                           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),1);
                      ncnn::Mat::Mat(in_stack_ffffffffffffefd0,
                                     (int)((ulong)in_stack_ffffffffffffefc8 >> 0x20),
                                     (int)in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,
                                     in_stack_ffffffffffffefb8,0,(int)in_stack_ffffffffffffefe0,
                                     _allocator);
                      ncnn::Mat::operator=
                                ((Mat *)in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
                      ncnn::Mat::~Mat((Mat *)0x16aa88);
                    }
                    local_ea8 = local_ea8 + 4;
                  }
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_ffffffffffffefd0,(size_type)in_stack_ffffffffffffefc8);
                for (local_f84 = 0; local_f84 < local_b3c; local_f84 = local_f84 + 1) {
                  in_stack_ffffffffffffefd8 = (ParamDict *)(in_RDI + 0x28);
                  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_b58->bottoms,(long)local_f84);
                  pvVar4 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_ffffffffffffefd8,(long)*pvVar3);
                  in_stack_ffffffffffffefe0 = &pvVar4->shape;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (&local_b58->bottom_shapes,(long)local_f84);
                  ncnn::Mat::operator=((Mat *)in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
                }
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                           in_stack_ffffffffffffefd0,(size_type)in_stack_ffffffffffffefc8);
                for (local_f88 = 0; local_f88 < local_b40; local_f88 = local_f88 + 1) {
                  in_stack_ffffffffffffefc8 = (Net *)(in_RDI + 0x28);
                  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (&local_b58->tops,(long)local_f88);
                  pvVar4 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                     ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)
                                      in_stack_ffffffffffffefc8,(long)*pvVar3);
                  in_stack_ffffffffffffefd0 = &pvVar4->shape;
                  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (&local_b58->top_shapes,(long)local_f88);
                  ncnn::Mat::operator=((Mat *)in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0);
                }
                in_stack_ffffffffffffefc4 = (*local_b58->_vptr_Layer[2])(local_b58,local_928);
                if (in_stack_ffffffffffffefc4 == 0) {
                  in_stack_ffffffffffffefb8 = local_b58;
                  ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                       (in_RDI + 0x40),(long)local_930);
                  *ppLVar5 = in_stack_ffffffffffffefb8;
                  local_b50 = 0;
                }
                else {
                  fprintf(_stderr,"layer load_param failed");
                  fprintf(_stderr,"\n");
                  local_b50 = 0xe;
                }
                ncnn::Mat::~Mat((Mat *)0x16ad17);
              }
              else {
                fprintf(_stderr,"ParamDict load_param failed");
                fprintf(_stderr,"\n");
              }
            }
            local_4 = 0;
LAB_0016ad63:
            local_b50 = 1;
            ParamDict::~ParamDict
                      ((ParamDict *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0));
          }
        }
        else {
          fprintf(_stderr,"parse blob_count failed");
          fprintf(_stderr,"\n");
          local_4 = -1;
        }
      }
      else {
        fprintf(_stderr,"parse layer_count failed");
        fprintf(_stderr,"\n");
        local_4 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate");
      fprintf(_stderr,"\n");
      local_4 = -1;
    }
  }
  else {
    fprintf(_stderr,"parse magic failed");
    fprintf(_stderr,"\n");
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v) \
    if (dr.scan(fmt, &v) != 1) \
    { \
        NCNN_LOGE("parse " #v " failed"); \
        return -1; \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    layers.resize((size_t)layer_count);
    blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;

#if __APPLE__
        opt.use_image_storage = false;
#endif
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i=0; i<layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_layer(layer_type);
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
//         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j=0; j<bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
//                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            Blob& blob = blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
//             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param failed");
            continue;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j=0; j<top_count; j++)
            {
                Blob& blob = blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            layer->bottom_shapes[j] = blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            layer->top_shapes[j] = blobs[layer->tops[j]].shape;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param failed");
            continue;
        }

        layers[i] = layer;
    }

#undef SCAN_VALUE
    return 0;
}